

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_expressionlistref.cpp
# Opt level: O1

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::Bind(Binder *this,ExpressionListRef *expr)

{
  pointer puVar1;
  pointer puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pLVar4;
  ClientContext *context;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var5;
  bool bVar6;
  _Head_base<0UL,_duckdb::BoundExpressionListRef_*,_false> _Var7;
  undefined1 auVar8 [8];
  Binder *pBVar9;
  undefined8 uVar10;
  element_type *peVar11;
  char cVar12;
  pointer pBVar13;
  reference pvVar14;
  long *plVar15;
  reference pvVar16;
  optional_ptr<duckdb::LogicalType,_true> result_type;
  idx_t iVar17;
  pointer pBVar18;
  reference pvVar19;
  reference pvVar20;
  type expr_00;
  ulong uVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  idx_t in_RDX;
  LogicalType *type;
  pointer type_00;
  element_type *peVar23;
  pointer *__ptr;
  ulong __val;
  size_type __n;
  char cVar24;
  size_type sVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  templated_unique_single_t result;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  list;
  string __str;
  _Head_base<0UL,_duckdb::BoundExpressionListRef_*,_false> local_128;
  bool local_119;
  undefined1 local_118 [8];
  undefined8 uStack_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  optional_idx local_e8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_e0;
  undefined8 local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined1 local_c0 [8];
  undefined8 local_b8;
  undefined1 auStack_b0 [32];
  LogicalType local_90 [4];
  
  local_f8._M_allocated_capacity = (size_type)expr;
  local_e8.index = in_RDX;
  auStack_b0._16_8_ = this;
  local_128._M_head_impl = (BoundExpressionListRef *)operator_new(0x68);
  ((local_128._M_head_impl)->super_BoundTableRef).type = EXPRESSION_LIST;
  ((local_128._M_head_impl)->super_BoundTableRef).sample.
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
  super__Head_base<0UL,_duckdb::SampleOptions_*,_false> =
       (_Head_base<0UL,_duckdb::SampleOptions_*,_false>)0x0;
  ((local_128._M_head_impl)->super_BoundTableRef)._vptr_BoundTableRef =
       (_func_int **)&PTR__BoundExpressionListRef_019ad008;
  ((local_128._M_head_impl)->values).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_128._M_head_impl)->values).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_128._M_head_impl)->values).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_128._M_head_impl)->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_128._M_head_impl)->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_128._M_head_impl)->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_128._M_head_impl)->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_128._M_head_impl)->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_128._M_head_impl)->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
            ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                          *)&local_128);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(pBVar13->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             (local_e8.index + 0x80));
  pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
            ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                          *)&local_128);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pBVar13->names,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_e8.index + 0x98));
  local_119 = *(bool *)(local_f8._M_allocated_capacity + 0x223);
  InsertBinder::InsertBinder
            ((InsertBinder *)(auStack_b0 + 0x18),(Binder *)local_f8._M_allocated_capacity,
             *(ClientContext **)(local_f8._M_allocated_capacity + 0x10));
  LogicalType::LogicalType((LogicalType *)local_118,INVALID);
  auVar8 = local_118;
  local_90[0].id_ = local_118[0];
  local_90[0].physical_type_ = local_118[1];
  aStack_108._M_allocated_capacity =
       (size_type)
       local_90[0].type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  uStack_110 = (Binder *)
               local_90[0].type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_118 = auVar8;
  LogicalType::~LogicalType((LogicalType *)local_118);
  local_f8._8_8_ = local_e8.index + 0x68;
  if (*(long *)(local_e8.index + 0x70) != *(long *)(local_e8.index + 0x68)) {
    peVar23 = (element_type *)0x0;
    do {
      local_d8 = peVar23;
      pvVar14 = vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
                ::operator[]((vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
                              *)local_f8._8_8_,(size_type)peVar23);
      pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                              *)&local_128);
      if (((pBVar13->names).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (pBVar13->names).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         ((pvVar14->
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (pvVar14->
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        __val = 0;
        do {
          pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                    ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                                  *)&local_128);
          cVar24 = '\x01';
          if (9 < __val) {
            uVar21 = __val;
            cVar12 = '\x04';
            do {
              cVar24 = cVar12;
              if (uVar21 < 100) {
                cVar24 = cVar24 + -2;
                goto LAB_007104aa;
              }
              if (uVar21 < 1000) {
                cVar24 = cVar24 + -1;
                goto LAB_007104aa;
              }
              if (uVar21 < 10000) goto LAB_007104aa;
              bVar6 = 99999 < uVar21;
              uVar21 = uVar21 / 10000;
              cVar12 = cVar24 + '\x04';
            } while (bVar6);
            cVar24 = cVar24 + '\x01';
          }
LAB_007104aa:
          local_c0 = (undefined1  [8])auStack_b0;
          ::std::__cxx11::string::_M_construct((ulong)local_c0,cVar24);
          ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_c0,(uint)local_b8,__val);
          plVar15 = (long *)::std::__cxx11::string::replace((ulong)local_c0,0,(char *)0x0,0x138a20a)
          ;
          local_118 = (undefined1  [8])&aStack_108;
          paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar15 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar15 == paVar22) {
            aStack_108._M_allocated_capacity = paVar22->_M_allocated_capacity;
            aStack_108._8_8_ = plVar15[3];
          }
          else {
            aStack_108._M_allocated_capacity = paVar22->_M_allocated_capacity;
            local_118 = (undefined1  [8])*plVar15;
          }
          uStack_110 = (Binder *)plVar15[1];
          *plVar15 = (long)paVar22;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &pBVar13->names,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118)
          ;
          if (local_118 != (undefined1  [8])&aStack_108) {
            operator_delete((void *)local_118);
          }
          if (local_c0 != (undefined1  [8])auStack_b0) {
            operator_delete((void *)local_c0);
          }
          __val = __val + 1;
        } while (__val < (ulong)((long)(pvVar14->
                                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                       ).
                                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar14->
                                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                       ).
                                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      *(bool *)(local_f8._M_allocated_capacity + 0x223) = true;
      local_118 = (undefined1  [8])0x0;
      uStack_110 = (Binder *)0x0;
      aStack_108._M_allocated_capacity = 0;
      if ((pvVar14->
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (pvVar14->
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        sVar25 = 0;
        do {
          pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                    ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                                  *)&local_128);
          if ((pBVar13->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (pBVar13->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                      ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                                    *)&local_128);
            pvVar16 = vector<duckdb::LogicalType,_true>::operator[](&pBVar13->types,sVar25);
            if (local_90 != pvVar16) {
              local_90[0].id_ = pvVar16->id_;
              local_90[0].physical_type_ = pvVar16->physical_type_;
              shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                        (&local_90[0].type_info_,&pvVar16->type_info_);
            }
          }
          result_type.ptr =
               (LogicalType *)
               vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::operator[](pvVar14,sVar25);
          ExpressionBinder::Bind
                    ((ExpressionBinder *)local_c0,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)(auStack_b0 + 0x18),result_type,false);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)local_118,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)local_c0);
          if (local_c0 != (undefined1  [8])0x0) {
            (**(code **)(*(_func_int **)local_c0 + 8))();
          }
          sVar25 = sVar25 + 1;
        } while (sVar25 < (ulong)((long)(pvVar14->
                                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pvVar14->
                                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                              *)&local_128);
      ::std::
      vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>>
      ::
      emplace_back<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
                ((vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>>
                  *)&pBVar13->values,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_118);
      *(bool *)(local_f8._M_allocated_capacity + 0x223) = local_119;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_118);
      peVar23 = (element_type *)((long)&local_d8->_vptr_ExtraTypeInfo + 1);
    } while (peVar23 < (element_type *)
                       ((*(long *)(local_e8.index + 0x70) - *(long *)(local_e8.index + 0x68) >> 3) *
                       -0x5555555555555555));
  }
  pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
            ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                          *)&local_128);
  if (((pBVar13->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (pBVar13->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (*(long *)(local_e8.index + 0x68) != *(long *)(local_e8.index + 0x70))) {
    pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
              ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                            *)&local_128);
    pvVar14 = vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
              ::operator[]((vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
                            *)local_f8._8_8_,0);
    puVar1 = (pvVar14->
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (pvVar14->
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    LogicalType::LogicalType((LogicalType *)local_118,SQLNULL);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::resize
              (&(pBVar13->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               (long)puVar2 - (long)puVar1 >> 3,(value_type *)local_118);
    LogicalType::~LogicalType((LogicalType *)local_118);
    local_f8._8_8_ =
         (vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
          *)0x0;
    while (pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                     ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                                   *)&local_128),
          (ulong)local_f8._8_8_ <
          (vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
           *)(((long)(pBVar13->values).
                     super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                     .
                     super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pBVar13->values).
                     super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                     .
                     super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
      pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                              *)&local_128);
      pvVar19 = vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_true>
                ::operator[](&pBVar13->values,local_f8._8_8_);
      if ((pvVar19->
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (pvVar19->
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        sVar25 = 0;
        do {
          pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                    ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                                  *)&local_128);
          pvVar16 = vector<duckdb::LogicalType,_true>::operator[](&pBVar13->types,sVar25);
          pvVar20 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](pvVar19,sVar25);
          expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(pvVar20);
          ExpressionBinder::GetExpressionReturnType((LogicalType *)local_118,expr_00);
          LogicalType::MaxLogicalType
                    ((LogicalType *)local_c0,
                     *(ClientContext **)(local_f8._M_allocated_capacity + 0x10),pvVar16,
                     (LogicalType *)local_118);
          pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                    ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                                  *)&local_128);
          pvVar16 = vector<duckdb::LogicalType,_true>::operator[](&pBVar13->types,sVar25);
          uVar10 = auStack_b0._0_8_;
          peVar11 = local_b8;
          pvVar16->id_ = local_c0[0];
          pvVar16->physical_type_ = local_c0[1];
          uVar26 = *(undefined4 *)
                    &(pvVar16->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar27 = *(undefined4 *)
                    ((long)&(pvVar16->type_info_).internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4);
          peVar23 = (pvVar16->type_info_).internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar28 = *(undefined4 *)
                    &(pvVar16->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
          uVar29 = *(undefined4 *)
                    ((long)&(pvVar16->type_info_).internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4);
          (pvVar16->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pvVar16->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_b8 = (element_type *)0x0;
          auStack_b0._0_8_ = (element_type *)0x0;
          p_Var3 = (pvVar16->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          (pvVar16->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar11;
          (pvVar16->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_d8 = peVar23;
            uStack_d0 = uVar28;
            uStack_cc = uVar29;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
            uVar26 = (undefined4)local_d8;
            uVar27 = local_d8._4_4_;
            uVar28 = uStack_d0;
            uVar29 = uStack_cc;
          }
          uVar10 = auStack_b0._0_8_;
          local_b8 = (element_type *)CONCAT44(uVar27,uVar26);
          auStack_b0._4_4_ = uVar29;
          auStack_b0._0_4_ = uVar28;
          if ((element_type *)uVar10 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10);
          }
          LogicalType::~LogicalType((LogicalType *)local_c0);
          LogicalType::~LogicalType((LogicalType *)local_118);
          sVar25 = sVar25 + 1;
        } while (sVar25 < (ulong)((long)(pvVar19->
                                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pvVar19->
                                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      local_f8._8_8_ = local_f8._8_8_ + 1;
    }
    pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
              ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                            *)&local_128);
    type_00 = (pBVar13->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start;
    pLVar4 = (pBVar13->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (type_00 != pLVar4) {
      do {
        LogicalType::NormalizeType((LogicalType *)local_118,type_00);
        uVar10 = aStack_108._M_allocated_capacity;
        pBVar9 = uStack_110;
        type_00->id_ = local_118[0];
        type_00->physical_type_ = local_118[1];
        uVar26 = *(undefined4 *)
                  &(type_00->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar27 = *(undefined4 *)
                  ((long)&(type_00->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4);
        peVar23 = (type_00->type_info_).internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar28 = *(undefined4 *)
                  &(type_00->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
        uVar29 = *(undefined4 *)
                  ((long)&(type_00->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 4);
        (type_00->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (type_00->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        uStack_110 = (Binder *)0x0;
        aStack_108._M_allocated_capacity = 0;
        p_Var3 = (type_00->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (type_00->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)pBVar9;
        (type_00->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_d8 = peVar23;
          uStack_d0 = uVar28;
          uStack_cc = uVar29;
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          uVar26 = (undefined4)local_d8;
          uVar27 = local_d8._4_4_;
          uVar28 = uStack_d0;
          uVar29 = uStack_cc;
        }
        uVar10 = aStack_108._M_allocated_capacity;
        uStack_110 = (Binder *)CONCAT44(uVar27,uVar26);
        aStack_108._M_allocated_capacity._4_4_ = uVar29;
        aStack_108._M_allocated_capacity._0_4_ = uVar28;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10);
        }
        LogicalType::~LogicalType((LogicalType *)local_118);
        type_00 = type_00 + 1;
      } while (type_00 != pLVar4);
    }
    peVar23 = (element_type *)0x0;
    while (pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                     ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                                   *)&local_128),
          peVar23 < (element_type *)
                    (((long)(pBVar13->values).
                            super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                            .
                            super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pBVar13->values).
                            super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                            .
                            super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))
    {
      pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                              *)&local_128);
      pvVar19 = vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_true>
                ::operator[](&pBVar13->values,(size_type)peVar23);
      local_d8 = peVar23;
      if ((pvVar19->
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (pvVar19->
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        __n = 0;
        do {
          context = *(ClientContext **)(local_f8._M_allocated_capacity + 0x10);
          pvVar20 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](pvVar19,__n);
          local_e0._M_head_impl =
               (pvVar20->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pvVar20->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                    ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                                  *)&local_128);
          pvVar16 = vector<duckdb::LogicalType,_true>::operator[](&pBVar13->types,__n);
          BoundCastExpression::AddCastToType
                    ((BoundCastExpression *)local_118,context,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_e0,pvVar16,false);
          pvVar20 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](pvVar19,__n);
          auVar8 = local_118;
          local_118 = (undefined1  [8])0x0;
          _Var5._M_head_impl =
               (pvVar20->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pvVar20->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)auVar8;
          if (_Var5._M_head_impl != (Expression *)0x0) {
            (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
          }
          if (local_118 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_118 + 8))();
          }
          local_118 = (undefined1  [8])0x0;
          if (local_e0._M_head_impl != (Expression *)0x0) {
            (*((local_e0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_e0._M_head_impl = (Expression *)0x0;
          __n = __n + 1;
        } while (__n < (ulong)((long)(pvVar19->
                                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar19->
                                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      peVar23 = (element_type *)((long)&local_d8->_vptr_ExtraTypeInfo + 1);
    }
  }
  iVar17 = GenerateTableIndex((Binder *)local_f8._M_allocated_capacity);
  pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
            ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                          *)&local_128);
  pBVar13->bind_index = iVar17;
  pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
            ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                          *)&local_128);
  iVar17 = pBVar13->bind_index;
  pBVar13 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
            ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                          *)&local_128);
  pBVar18 = unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
            ::operator->((unique_ptr<duckdb::BoundExpressionListRef,_std::default_delete<duckdb::BoundExpressionListRef>,_true>
                          *)&local_128);
  BindContext::AddGenericBinding
            ((BindContext *)(local_f8._M_allocated_capacity + 0x88),iVar17,
             (string *)(local_e8.index + 0x10),&pBVar13->names,&pBVar18->types);
  _Var7._M_head_impl = local_128._M_head_impl;
  local_128._M_head_impl = (BoundExpressionListRef *)0x0;
  ((Binding *)auStack_b0._16_8_)->_vptr_Binding = (_func_int **)_Var7._M_head_impl;
  ExpressionBinder::~ExpressionBinder((ExpressionBinder *)(auStack_b0 + 0x18));
  if (local_128._M_head_impl != (BoundExpressionListRef *)0x0) {
    (*((local_128._M_head_impl)->super_BoundTableRef)._vptr_BoundTableRef[1])();
  }
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (_Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
         auStack_b0._16_8_;
}

Assistant:

unique_ptr<BoundTableRef> Binder::Bind(ExpressionListRef &expr) {
	auto result = make_uniq<BoundExpressionListRef>();
	result->types = expr.expected_types;
	result->names = expr.expected_names;
	auto prev_can_contain_nulls = this->can_contain_nulls;
	// bind value list
	InsertBinder binder(*this, context);
	binder.target_type = LogicalType(LogicalTypeId::INVALID);
	for (idx_t list_idx = 0; list_idx < expr.values.size(); list_idx++) {
		auto &expression_list = expr.values[list_idx];
		if (result->names.empty()) {
			// no names provided, generate them
			for (idx_t val_idx = 0; val_idx < expression_list.size(); val_idx++) {
				result->names.push_back("col" + to_string(val_idx));
			}
		}

		this->can_contain_nulls = true;
		vector<unique_ptr<Expression>> list;
		for (idx_t val_idx = 0; val_idx < expression_list.size(); val_idx++) {
			if (!result->types.empty()) {
				D_ASSERT(result->types.size() == expression_list.size());
				binder.target_type = result->types[val_idx];
			}
			auto bound_expr = binder.Bind(expression_list[val_idx]);
			list.push_back(std::move(bound_expr));
		}
		result->values.push_back(std::move(list));
		this->can_contain_nulls = prev_can_contain_nulls;
	}
	if (result->types.empty() && !expr.values.empty()) {
		// there are no types specified
		// we have to figure out the result types
		// for each column, we iterate over all of the expressions and select the max logical type
		// we initialize all types to SQLNULL
		result->types.resize(expr.values[0].size(), LogicalType::SQLNULL);
		// now loop over the lists and select the max logical type
		for (idx_t list_idx = 0; list_idx < result->values.size(); list_idx++) {
			auto &list = result->values[list_idx];
			for (idx_t val_idx = 0; val_idx < list.size(); val_idx++) {
				auto &current_type = result->types[val_idx];
				auto next_type = ExpressionBinder::GetExpressionReturnType(*list[val_idx]);
				result->types[val_idx] = LogicalType::MaxLogicalType(context, current_type, next_type);
			}
		}
		for (auto &type : result->types) {
			type = LogicalType::NormalizeType(type);
		}
		// finally do another loop over the expressions and add casts where required
		for (idx_t list_idx = 0; list_idx < result->values.size(); list_idx++) {
			auto &list = result->values[list_idx];
			for (idx_t val_idx = 0; val_idx < list.size(); val_idx++) {
				list[val_idx] =
				    BoundCastExpression::AddCastToType(context, std::move(list[val_idx]), result->types[val_idx]);
			}
		}
	}
	result->bind_index = GenerateTableIndex();
	bind_context.AddGenericBinding(result->bind_index, expr.alias, result->names, result->types);
	return std::move(result);
}